

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_change.c
# Opt level: O3

int speed_segment_free(mixed_segment *segment)

{
  void *pvVar1;
  
  pvVar1 = segment->data;
  if (pvVar1 != (void *)0x0) {
    if (*(SRC_STATE **)((long)pvVar1 + 0x10) != (SRC_STATE *)0x0) {
      src_delete(*(SRC_STATE **)((long)pvVar1 + 0x10));
    }
    (*mixed_free)(pvVar1);
  }
  segment->data = (void *)0x0;
  return 1;
}

Assistant:

int speed_segment_free(struct mixed_segment *segment){
  struct speed_segment_data *data = (struct speed_segment_data *)segment->data;
  if(data){
    if(data->resample_state){
      src_delete(data->resample_state);
    }
    mixed_free(data);
  }
  segment->data = 0;
  return 1;
}